

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O2

sysbvm_tuple_t sysbvm_filesystem_dirname(sysbvm_context_t *context,sysbvm_tuple_t path)

{
  char *pcVar1;
  _Bool _Var2;
  ulong uVar3;
  sysbvm_tuple_t sVar4;
  ulong uVar5;
  size_t stringSize;
  
  _Var2 = sysbvm_tuple_isBytes(path);
  if (!_Var2) {
    return path;
  }
  if ((path & 0xf) == 0 && path != 0) {
    uVar3 = (ulong)*(uint *)(path + 0xc);
  }
  else {
    uVar3 = 0;
  }
  uVar5 = 0;
  stringSize = 0;
  while (uVar3 != uVar5) {
    pcVar1 = (char *)(path + 0x10) + uVar5;
    uVar5 = uVar5 + 1;
    if (*pcVar1 == '/') {
      stringSize = uVar5;
    }
  }
  sVar4 = sysbvm_string_createWithString(context,stringSize,(char *)(path + 0x10));
  return sVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_filesystem_dirname(sysbvm_context_t *context, sysbvm_tuple_t path)
{
    if(!sysbvm_tuple_isBytes(path))
        return path;

    size_t pathSize = sysbvm_tuple_getSizeInBytes(path);
    uint8_t *pathBytes = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(path)->bytes;
    size_t dirnameEnd = 0;
    for(size_t i = 0; i < pathSize; ++i)
    {
        char separator = pathBytes[i];
        if(separator == '/')
            dirnameEnd = i + 1;
#ifdef _WIN32
        else if(separator == '\\')
            dirnameEnd = i + 1;
#endif
    }

    return sysbvm_string_createWithString(context, dirnameEnd, (const char*)pathBytes);
}